

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Builder * __thiscall
capnproto_test::capnp::test::TestDefaults::Builder::getEnumList
          (Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder builder;
  uint ptrIndex;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  ptrIndex = ::capnp::bounded<18u>();
  ::capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,ptrIndex);
  builder.capTable = local_28.capTable;
  builder.segment = local_28.segment;
  builder.pointer = local_28.pointer;
  ::capnp::_::
  PointerHelpers<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>,_(capnp::Kind)6>
  ::get(__return_storage_ptr__,builder,(word *)&DAT_00a14b18);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::capnproto_test::capnp::test::TestEnum,  ::capnp::Kind::ENUM>::Builder TestDefaults::Builder::getEnumList() {
  return ::capnp::_::PointerHelpers< ::capnp::List< ::capnproto_test::capnp::test::TestEnum,  ::capnp::Kind::ENUM>>::get(_builder.getPointerField(
      ::capnp::bounded<18>() * ::capnp::POINTERS),
        ::capnp::schemas::bp_eb3f9ebe98c73cb6 + 940);
}